

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O3

void __thiscall ManyDoublesWriteTest::RunShard(ManyDoublesWriteTest *this,int shard)

{
  int *piVar1;
  uint uVar2;
  char *message;
  uint uVar3;
  bool bVar4;
  AssertionResult gtest_ar;
  uint64_t them_bits;
  uint64_t bits;
  char *endptr;
  char buffer [100];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  double local_b8;
  uint64_t local_b0;
  AssertHelper local_a8;
  char *local_a0;
  char local_98 [104];
  
  uVar3 = 0xffffffff;
  uVar2 = shard;
  do {
    if ((shard == 0) && (uVar2 >> 0x18 != uVar3)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)uVar2,
             (ulong)(uint)(int)(((double)uVar2 * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar3 = uVar2 >> 0x18;
    }
    local_b0 = CONCAT44(uVar2,uVar2);
    if ((~uVar2 & 0x7ff00000) != 0) {
      wabt::WriteDoubleHex(local_98,100,local_b0);
      local_b8 = strtod(local_98,&local_a0);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_c8,"bits","them_bits",&local_b0,(unsigned_long *)&local_b8);
      if (local_c8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        if (local_c0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((local_c0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-hexfloat.cc"
                   ,0xdd,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (((local_d0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
           (local_d0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d0.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    piVar1 = &(this->super_ThreadedTest).num_threads_;
    bVar4 = CARRY4(uVar2,*piVar1);
    uVar2 = uVar2 + *piVar1;
  } while (!bVar4);
  if (shard == 0) {
    puts("done.");
    fflush(_stdout);
  }
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(halfbits) {
      LOG_COMPLETION(halfbits);
      uint64_t bits = (static_cast<uint64_t>(halfbits) << 32) | halfbits;
      if (is_infinity_or_nan(bits))
        continue;

      WriteDoubleHex(buffer, sizeof(buffer), bits);

      char* endptr;
      double them_double = strtod(buffer, &endptr);
      uint64_t them_bits = bit_cast<uint64_t>(them_double);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }